

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O2

Element_conflict
Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::_multiply
          (Element_conflict element,Element_conflict v)

{
  Element_conflict EVar1;
  Characteristic CVar2;
  Element_conflict a;
  
  EVar1 = 0;
  for (; element != 0; element = element >> 1) {
    if ((element & 1) != 0) {
      CVar2 = 0;
      if (characteristic_ - EVar1 <= v) {
        CVar2 = characteristic_;
      }
      EVar1 = (EVar1 + v) - CVar2;
    }
    CVar2 = 0;
    if (characteristic_ - v <= v) {
      CVar2 = characteristic_;
    }
    v = v * 2 - CVar2;
  }
  return EVar1;
}

Assistant:

static Element _multiply(Element element, Element v) {
    Element a = element;
    element = 0;
    Element temp_b;

    while (a != 0) {
      if (a & 1) {
        if (v >= characteristic_ - element) element -= characteristic_;
        element += v;
      }
      a >>= 1;

      temp_b = v;
      if (v >= characteristic_ - v) temp_b -= characteristic_;
      v += temp_b;
    }

    return element;
  }